

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validator.cc
# Opt level: O3

void __thiscall
wabt::anon_unknown_7::Validator::CheckAtomicAlign
          (Validator *this,Location *loc,Address alignment,Address natural_alignment)

{
  if (alignment != 0xffffffff) {
    if (POPCOUNT(alignment) != 1) {
      PrintError(this,loc,"alignment must be power-of-two");
    }
    if (alignment != natural_alignment) {
      PrintError(this,loc,"alignment must be equal to natural alignment (%u)",
                 (ulong)natural_alignment);
      return;
    }
  }
  return;
}

Assistant:

void Validator::CheckAtomicAlign(const Location* loc,
                                 Address alignment,
                                 Address natural_alignment) {
  if (alignment != WABT_USE_NATURAL_ALIGNMENT) {
    if (!is_power_of_two(alignment)) {
      PrintError(loc, "alignment must be power-of-two");
    }
    if (alignment != natural_alignment) {
      PrintError(loc, "alignment must be equal to natural alignment (%u)",
                 natural_alignment);
    }
  }
}